

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_open_memory.c
# Opt level: O0

int64_t memory_read_seek(archive *a,void *client_data,int64_t offset,int whence)

{
  read_memory_data_conflict *mine;
  int whence_local;
  int64_t offset_local;
  void *client_data_local;
  archive *a_local;
  long local_8;
  
  if (whence == 0) {
    *(long *)((long)client_data + 8) = *client_data + offset;
  }
  else if (whence == 1) {
    *(int64_t *)((long)client_data + 8) = offset + *(long *)((long)client_data + 8);
  }
  else {
    if (whence != 2) {
      return -0x1e;
    }
    *(long *)((long)client_data + 8) = *(long *)((long)client_data + 0x10) + offset;
  }
  if (*(ulong *)((long)client_data + 8) < *client_data) {
    *(undefined8 *)((long)client_data + 8) = *client_data;
    local_8 = -0x19;
  }
  else if (*(ulong *)((long)client_data + 0x10) < *(ulong *)((long)client_data + 8)) {
    *(undefined8 *)((long)client_data + 8) = *(undefined8 *)((long)client_data + 0x10);
    local_8 = -0x19;
  }
  else {
    local_8 = *(long *)((long)client_data + 8) - *client_data;
  }
  return local_8;
}

Assistant:

static int64_t
memory_read_seek(struct archive *a, void *client_data, int64_t offset, int whence)
{
	struct read_memory_data *mine = (struct read_memory_data *)client_data;

	(void)a; /* UNUSED */
	switch (whence) {
	case SEEK_SET:
		mine->p = mine->start + offset;
		break;
	case SEEK_END:
		mine->p = mine->end + offset;
		break;
	case SEEK_CUR:
		mine->p += offset;
		break;
	}
	if (mine->p < mine->start) {
		mine->p = mine->start;
		return ARCHIVE_FAILED;
	}
	if (mine->p > mine->end) {
		mine->p = mine->end;
		return ARCHIVE_FAILED;
	}
	return (mine->p - mine->start);
}